

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateValueContent(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  int local_1c;
  xmlRelaxNGDefinePtr pxStack_18;
  int ret;
  xmlRelaxNGDefinePtr_conflict defines_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  local_1c = 0;
  pxStack_18 = defines;
  while ((pxStack_18 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
         (local_1c = xmlRelaxNGValidateValue(ctxt,pxStack_18), local_1c == 0))) {
    pxStack_18 = pxStack_18->next;
  }
  return local_1c;
}

Assistant:

static int
xmlRelaxNGValidateValueContent(xmlRelaxNGValidCtxtPtr ctxt,
                               xmlRelaxNGDefinePtr defines)
{
    int ret = 0;

    while (defines != NULL) {
        ret = xmlRelaxNGValidateValue(ctxt, defines);
        if (ret != 0)
            break;
        defines = defines->next;
    }
    return (ret);
}